

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImplicitTrapezoidal.cpp
# Opt level: O2

bool __thiscall
iDynTree::optimalcontrol::integrators::ImplicitTrapezoidal::
evaluateCollocationConstraintSecondDerivatives
          (ImplicitTrapezoidal *this,double time,
          vector<iDynTree::VectorDynSize,_std::allocator<iDynTree::VectorDynSize>_>
          *collocationPoints,
          vector<iDynTree::VectorDynSize,_std::allocator<iDynTree::VectorDynSize>_> *controlInputs,
          double dT,VectorDynSize *lambda,CollocationHessianMap *stateSecondDerivative,
          CollocationHessianMap *controlSecondDerivative,
          CollocationHessianMap *stateControlSecondDerivative)

{
  VectorDynSize *vec;
  MatrixDynSize *pMVar1;
  element_type *peVar2;
  int iVar3;
  mapped_type *pmVar4;
  ostream *poVar5;
  string *psVar6;
  char *pcVar7;
  pointer pcVar8;
  undefined4 uVar9;
  Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> local_1f8;
  MatrixDynSize *local_1d8;
  MatrixDynSize *local_1d0;
  MatrixDynSize *local_1c8;
  ostringstream errorMsg;
  Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> local_48;
  
  peVar2 = (this->super_FixedStepIntegrator).super_Integrator.m_dynamicalSystem_ptr.
           super___shared_ptr<iDynTree::optimalcontrol::DynamicalSystem,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  if (peVar2 == (element_type *)0x0) {
    psVar6 = IntegratorInfo::name_abi_cxx11_
                       (&(this->super_FixedStepIntegrator).super_Integrator.m_info);
    pcVar8 = (psVar6->_M_dataplus)._M_p;
    pcVar7 = "Dynamical system not set.";
LAB_001a8d24:
    iDynTree::reportError(pcVar8,"evaluateCollocationConstraintSecondDerivatives",pcVar7);
  }
  else {
    if ((long)(collocationPoints->
              super__Vector_base<iDynTree::VectorDynSize,_std::allocator<iDynTree::VectorDynSize>_>)
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)(collocationPoints->
              super__Vector_base<iDynTree::VectorDynSize,_std::allocator<iDynTree::VectorDynSize>_>)
              ._M_impl.super__Vector_impl_data._M_start == 0x40) {
      if ((long)(controlInputs->
                super__Vector_base<iDynTree::VectorDynSize,_std::allocator<iDynTree::VectorDynSize>_>
                )._M_impl.super__Vector_impl_data._M_finish -
          (long)(controlInputs->
                super__Vector_base<iDynTree::VectorDynSize,_std::allocator<iDynTree::VectorDynSize>_>
                )._M_impl.super__Vector_impl_data._M_start == 0x40) {
        iVar3 = (*peVar2->_vptr_DynamicalSystem[3])();
        if ((char)iVar3 == '\0') {
LAB_001a8e3d:
          psVar6 = IntegratorInfo::name_abi_cxx11_
                             (&(this->super_FixedStepIntegrator).super_Integrator.m_info);
          pcVar8 = (psVar6->_M_dataplus)._M_p;
          pcVar7 = "Error while setting the control input.";
        }
        else {
          toEigen(&local_1f8,lambda);
          vec = &this->m_lambda;
          toEigen(&local_48,vec);
          Eigen::internal::
          call_assignment<Eigen::Map<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::Stride<0,0>>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const,Eigen::Map<Eigen::Matrix<double,_1,1,0,_1,1>const,0,Eigen::Stride<0,0>>const>>
                    (&local_48,
                     (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>
                      *)&errorMsg);
          peVar2 = (this->super_FixedStepIntegrator).super_Integrator.m_dynamicalSystem_ptr.
                   super___shared_ptr<iDynTree::optimalcontrol::DynamicalSystem,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr;
          pMVar1 = &this->m_stateHessianBuffer;
          uVar9 = SUB84(time,0);
          iVar3 = (*peVar2->_vptr_DynamicalSystem[0xd])
                            (uVar9,peVar2,
                             (collocationPoints->
                             super__Vector_base<iDynTree::VectorDynSize,_std::allocator<iDynTree::VectorDynSize>_>
                             )._M_impl.super__Vector_impl_data._M_start,vec,pMVar1);
          if ((char)iVar3 == '\0') {
LAB_001a8e5f:
            psVar6 = IntegratorInfo::name_abi_cxx11_
                               (&(this->super_FixedStepIntegrator).super_Integrator.m_info);
            pcVar8 = (psVar6->_M_dataplus)._M_p;
            pcVar7 = "Error while evaluating the dynamical system state second derivative.";
          }
          else {
            CollocationHessianIndex::CollocationHessianIndex
                      ((CollocationHessianIndex *)&errorMsg,0,0);
            pmVar4 = std::
                     map<iDynTree::optimalcontrol::integrators::CollocationHessianIndex,_iDynTree::MatrixDynSize,_std::less<iDynTree::optimalcontrol::integrators::CollocationHessianIndex>,_std::allocator<std::pair<const_iDynTree::optimalcontrol::integrators::CollocationHessianIndex,_iDynTree::MatrixDynSize>_>_>
                     ::operator[](stateSecondDerivative,(CollocationHessianIndex *)&errorMsg);
            local_1c8 = pMVar1;
            iDynTree::MatrixDynSize::operator=(pmVar4,pMVar1);
            CollocationHessianIndex::CollocationHessianIndex
                      ((CollocationHessianIndex *)&errorMsg,0,1);
            pmVar4 = std::
                     map<iDynTree::optimalcontrol::integrators::CollocationHessianIndex,_iDynTree::MatrixDynSize,_std::less<iDynTree::optimalcontrol::integrators::CollocationHessianIndex>,_std::allocator<std::pair<const_iDynTree::optimalcontrol::integrators::CollocationHessianIndex,_iDynTree::MatrixDynSize>_>_>
                     ::operator[](stateSecondDerivative,(CollocationHessianIndex *)&errorMsg);
            iDynTree::MatrixDynSize::operator=(pmVar4,&this->m_zeroNxNxBuffer);
            peVar2 = (this->super_FixedStepIntegrator).super_Integrator.m_dynamicalSystem_ptr.
                     super___shared_ptr<iDynTree::optimalcontrol::DynamicalSystem,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr;
            pMVar1 = &this->m_controlHessianBuffer;
            iVar3 = (*peVar2->_vptr_DynamicalSystem[0xe])
                              (uVar9,peVar2,
                               (collocationPoints->
                               super__Vector_base<iDynTree::VectorDynSize,_std::allocator<iDynTree::VectorDynSize>_>
                               )._M_impl.super__Vector_impl_data._M_start,vec,pMVar1);
            if ((char)iVar3 == '\0') {
LAB_001a8e81:
              psVar6 = IntegratorInfo::name_abi_cxx11_
                                 (&(this->super_FixedStepIntegrator).super_Integrator.m_info);
              pcVar8 = (psVar6->_M_dataplus)._M_p;
              pcVar7 = "Error while evaluating the dynamical system control second derivative.";
              goto LAB_001a8d24;
            }
            CollocationHessianIndex::CollocationHessianIndex
                      ((CollocationHessianIndex *)&errorMsg,0,0);
            pmVar4 = std::
                     map<iDynTree::optimalcontrol::integrators::CollocationHessianIndex,_iDynTree::MatrixDynSize,_std::less<iDynTree::optimalcontrol::integrators::CollocationHessianIndex>,_std::allocator<std::pair<const_iDynTree::optimalcontrol::integrators::CollocationHessianIndex,_iDynTree::MatrixDynSize>_>_>
                     ::operator[](controlSecondDerivative,(CollocationHessianIndex *)&errorMsg);
            local_1d0 = pMVar1;
            iDynTree::MatrixDynSize::operator=(pmVar4,pMVar1);
            CollocationHessianIndex::CollocationHessianIndex
                      ((CollocationHessianIndex *)&errorMsg,0,1);
            pmVar4 = std::
                     map<iDynTree::optimalcontrol::integrators::CollocationHessianIndex,_iDynTree::MatrixDynSize,_std::less<iDynTree::optimalcontrol::integrators::CollocationHessianIndex>,_std::allocator<std::pair<const_iDynTree::optimalcontrol::integrators::CollocationHessianIndex,_iDynTree::MatrixDynSize>_>_>
                     ::operator[](controlSecondDerivative,(CollocationHessianIndex *)&errorMsg);
            iDynTree::MatrixDynSize::operator=(pmVar4,&this->m_zeroNuNuBuffer);
            peVar2 = (this->super_FixedStepIntegrator).super_Integrator.m_dynamicalSystem_ptr.
                     super___shared_ptr<iDynTree::optimalcontrol::DynamicalSystem,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr;
            pMVar1 = &this->m_mixedHessianBuffer;
            iVar3 = (*peVar2->_vptr_DynamicalSystem[0xf])
                              (uVar9,peVar2,
                               (collocationPoints->
                               super__Vector_base<iDynTree::VectorDynSize,_std::allocator<iDynTree::VectorDynSize>_>
                               )._M_impl.super__Vector_impl_data._M_start,vec,pMVar1);
            if ((char)iVar3 != '\0') {
              CollocationHessianIndex::CollocationHessianIndex
                        ((CollocationHessianIndex *)&errorMsg,0,0);
              pmVar4 = std::
                       map<iDynTree::optimalcontrol::integrators::CollocationHessianIndex,_iDynTree::MatrixDynSize,_std::less<iDynTree::optimalcontrol::integrators::CollocationHessianIndex>,_std::allocator<std::pair<const_iDynTree::optimalcontrol::integrators::CollocationHessianIndex,_iDynTree::MatrixDynSize>_>_>
                       ::operator[](stateControlSecondDerivative,
                                    (CollocationHessianIndex *)&errorMsg);
              local_1d8 = pMVar1;
              iDynTree::MatrixDynSize::operator=(pmVar4,pMVar1);
              CollocationHessianIndex::CollocationHessianIndex
                        ((CollocationHessianIndex *)&errorMsg,0,1);
              pmVar4 = std::
                       map<iDynTree::optimalcontrol::integrators::CollocationHessianIndex,_iDynTree::MatrixDynSize,_std::less<iDynTree::optimalcontrol::integrators::CollocationHessianIndex>,_std::allocator<std::pair<const_iDynTree::optimalcontrol::integrators::CollocationHessianIndex,_iDynTree::MatrixDynSize>_>_>
                       ::operator[](stateControlSecondDerivative,
                                    (CollocationHessianIndex *)&errorMsg);
              iDynTree::MatrixDynSize::operator=(pmVar4,&this->m_zeroNxNuBuffer);
              CollocationHessianIndex::CollocationHessianIndex
                        ((CollocationHessianIndex *)&errorMsg,1,0);
              pmVar4 = std::
                       map<iDynTree::optimalcontrol::integrators::CollocationHessianIndex,_iDynTree::MatrixDynSize,_std::less<iDynTree::optimalcontrol::integrators::CollocationHessianIndex>,_std::allocator<std::pair<const_iDynTree::optimalcontrol::integrators::CollocationHessianIndex,_iDynTree::MatrixDynSize>_>_>
                       ::operator[](stateControlSecondDerivative,
                                    (CollocationHessianIndex *)&errorMsg);
              iDynTree::MatrixDynSize::operator=(pmVar4,&this->m_zeroNxNuBuffer);
              peVar2 = (this->super_FixedStepIntegrator).super_Integrator.m_dynamicalSystem_ptr.
                       super___shared_ptr<iDynTree::optimalcontrol::DynamicalSystem,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr;
              iVar3 = (*peVar2->_vptr_DynamicalSystem[3])
                                (peVar2,(controlInputs->
                                        super__Vector_base<iDynTree::VectorDynSize,_std::allocator<iDynTree::VectorDynSize>_>
                                        )._M_impl.super__Vector_impl_data._M_start + 0x20);
              pMVar1 = local_1c8;
              if ((char)iVar3 == '\0') goto LAB_001a8e3d;
              peVar2 = (this->super_FixedStepIntegrator).super_Integrator.m_dynamicalSystem_ptr.
                       super___shared_ptr<iDynTree::optimalcontrol::DynamicalSystem,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr;
              iVar3 = (*peVar2->_vptr_DynamicalSystem[0xd])
                                (peVar2,(collocationPoints->
                                        super__Vector_base<iDynTree::VectorDynSize,_std::allocator<iDynTree::VectorDynSize>_>
                                        )._M_impl.super__Vector_impl_data._M_start + 0x20,vec,
                                 local_1c8);
              if ((char)iVar3 == '\0') goto LAB_001a8e5f;
              CollocationHessianIndex::CollocationHessianIndex
                        ((CollocationHessianIndex *)&errorMsg,1,1);
              pmVar4 = std::
                       map<iDynTree::optimalcontrol::integrators::CollocationHessianIndex,_iDynTree::MatrixDynSize,_std::less<iDynTree::optimalcontrol::integrators::CollocationHessianIndex>,_std::allocator<std::pair<const_iDynTree::optimalcontrol::integrators::CollocationHessianIndex,_iDynTree::MatrixDynSize>_>_>
                       ::operator[](stateSecondDerivative,(CollocationHessianIndex *)&errorMsg);
              iDynTree::MatrixDynSize::operator=(pmVar4,pMVar1);
              pMVar1 = local_1d0;
              peVar2 = (this->super_FixedStepIntegrator).super_Integrator.m_dynamicalSystem_ptr.
                       super___shared_ptr<iDynTree::optimalcontrol::DynamicalSystem,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr;
              uVar9 = SUB84(time + dT,0);
              iVar3 = (*peVar2->_vptr_DynamicalSystem[0xe])
                                (uVar9,peVar2,
                                 (collocationPoints->
                                 super__Vector_base<iDynTree::VectorDynSize,_std::allocator<iDynTree::VectorDynSize>_>
                                 )._M_impl.super__Vector_impl_data._M_start + 0x20,vec,local_1d0);
              if ((char)iVar3 == '\0') goto LAB_001a8e81;
              CollocationHessianIndex::CollocationHessianIndex
                        ((CollocationHessianIndex *)&errorMsg,1,1);
              pmVar4 = std::
                       map<iDynTree::optimalcontrol::integrators::CollocationHessianIndex,_iDynTree::MatrixDynSize,_std::less<iDynTree::optimalcontrol::integrators::CollocationHessianIndex>,_std::allocator<std::pair<const_iDynTree::optimalcontrol::integrators::CollocationHessianIndex,_iDynTree::MatrixDynSize>_>_>
                       ::operator[](controlSecondDerivative,(CollocationHessianIndex *)&errorMsg);
              iDynTree::MatrixDynSize::operator=(pmVar4,pMVar1);
              pMVar1 = local_1d8;
              peVar2 = (this->super_FixedStepIntegrator).super_Integrator.m_dynamicalSystem_ptr.
                       super___shared_ptr<iDynTree::optimalcontrol::DynamicalSystem,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr;
              iVar3 = (*peVar2->_vptr_DynamicalSystem[0xf])
                                (uVar9,peVar2,
                                 (collocationPoints->
                                 super__Vector_base<iDynTree::VectorDynSize,_std::allocator<iDynTree::VectorDynSize>_>
                                 )._M_impl.super__Vector_impl_data._M_start + 0x20,vec,local_1d8);
              if ((char)iVar3 != '\0') {
                CollocationHessianIndex::CollocationHessianIndex
                          ((CollocationHessianIndex *)&errorMsg,1,1);
                pmVar4 = std::
                         map<iDynTree::optimalcontrol::integrators::CollocationHessianIndex,_iDynTree::MatrixDynSize,_std::less<iDynTree::optimalcontrol::integrators::CollocationHessianIndex>,_std::allocator<std::pair<const_iDynTree::optimalcontrol::integrators::CollocationHessianIndex,_iDynTree::MatrixDynSize>_>_>
                         ::operator[](stateControlSecondDerivative,
                                      (CollocationHessianIndex *)&errorMsg);
                iDynTree::MatrixDynSize::operator=(pmVar4,pMVar1);
                return true;
              }
            }
            psVar6 = IntegratorInfo::name_abi_cxx11_
                               (&(this->super_FixedStepIntegrator).super_Integrator.m_info);
            pcVar8 = (psVar6->_M_dataplus)._M_p;
            pcVar7 = 
            "Error while evaluating the dynamical system second derivative wrt state and control.";
          }
        }
        goto LAB_001a8d24;
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&errorMsg);
      std::operator<<((ostream *)&errorMsg,
                      "The size of the matrix containing the control inputs does not match the expected one. Input = "
                     );
      poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)&errorMsg);
      std::operator<<(poVar5,", Expected = 2.");
      psVar6 = IntegratorInfo::name_abi_cxx11_
                         (&(this->super_FixedStepIntegrator).super_Integrator.m_info);
      pcVar7 = (psVar6->_M_dataplus)._M_p;
      std::__cxx11::stringbuf::str();
      iDynTree::reportError
                (pcVar7,"evaluateCollocationConstraintSecondDerivatives",
                 (char *)local_1f8.
                         super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
                         .m_data);
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&errorMsg);
      std::operator<<((ostream *)&errorMsg,
                      "The size of the matrix containing the collocation point does not match the expected one. Input = "
                     );
      poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)&errorMsg);
      std::operator<<(poVar5,", Expected = 2.");
      psVar6 = IntegratorInfo::name_abi_cxx11_
                         (&(this->super_FixedStepIntegrator).super_Integrator.m_info);
      pcVar7 = (psVar6->_M_dataplus)._M_p;
      std::__cxx11::stringbuf::str();
      iDynTree::reportError
                (pcVar7,"evaluateCollocationConstraintSecondDerivatives",
                 (char *)local_1f8.
                         super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
                         .m_data);
    }
    std::__cxx11::string::~string((string *)&local_1f8);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&errorMsg);
  }
  return false;
}

Assistant:

bool ImplicitTrapezoidal::evaluateCollocationConstraintSecondDerivatives(double time, const std::vector<VectorDynSize> &collocationPoints,
                                                                                     const std::vector<VectorDynSize> &controlInputs, double dT, const VectorDynSize &lambda,
                                                                                     iDynTree::optimalcontrol::integrators::CollocationHessianMap &stateSecondDerivative,
                                                                                     iDynTree::optimalcontrol::integrators::CollocationHessianMap &controlSecondDerivative,
                                                                                     iDynTree::optimalcontrol::integrators::CollocationHessianMap &stateControlSecondDerivative)
            {
                if (!m_dynamicalSystem_ptr){
                    reportError(m_info.name().c_str(), "evaluateCollocationConstraintSecondDerivatives", "Dynamical system not set.");
                    return false;
                }

                if (collocationPoints.size() != 2){
                    std::ostringstream errorMsg;
                    errorMsg << "The size of the matrix containing the collocation point does not match the expected one. Input = ";
                    errorMsg << collocationPoints.size() << ", Expected = 2.";
                    reportError(m_info.name().c_str(), "evaluateCollocationConstraintSecondDerivatives", errorMsg.str().c_str());
                    return false;
                }

                if (controlInputs.size() != 2){
                    std::ostringstream errorMsg;
                    errorMsg << "The size of the matrix containing the control inputs does not match the expected one. Input = ";
                    errorMsg << controlInputs.size() << ", Expected = 2.";
                    reportError(m_info.name().c_str(), "evaluateCollocationConstraintSecondDerivatives", errorMsg.str().c_str());
                    return false;
                }

                if (!((m_dynamicalSystem_ptr->setControlInput(controlInputs[0])))){
                    reportError(m_info.name().c_str(), "evaluateCollocationConstraintSecondDerivatives", "Error while setting the control input.");
                    return false;
                }

                toEigen(m_lambda) = 0.5 * dT * toEigen(lambda);

                if (!(m_dynamicalSystem_ptr->dynamicsSecondPartialDerivativeWRTState(time, collocationPoints[0], m_lambda, m_stateHessianBuffer))) {
                    reportError(m_info.name().c_str(), "evaluateCollocationConstraintSecondDerivatives",
                                "Error while evaluating the dynamical system state second derivative.");
                    return false;
                }

                stateSecondDerivative[CollocationHessianIndex(0, 0)] = m_stateHessianBuffer;

                stateSecondDerivative[CollocationHessianIndex(0, 1)] = m_zeroNxNxBuffer;

                if (!(m_dynamicalSystem_ptr->dynamicsSecondPartialDerivativeWRTControl(time, collocationPoints[0], m_lambda, m_controlHessianBuffer))) {
                    reportError(m_info.name().c_str(), "evaluateCollocationConstraintSecondDerivatives",
                                "Error while evaluating the dynamical system control second derivative.");
                    return false;
                }

                controlSecondDerivative[CollocationHessianIndex(0, 0)] = m_controlHessianBuffer;

                controlSecondDerivative[CollocationHessianIndex(0, 1)] = m_zeroNuNuBuffer;

                if (!(m_dynamicalSystem_ptr->dynamicsSecondPartialDerivativeWRTStateControl(time, collocationPoints[0], m_lambda, m_mixedHessianBuffer))) {
                    reportError(m_info.name().c_str(), "evaluateCollocationConstraintSecondDerivatives",
                                "Error while evaluating the dynamical system second derivative wrt state and control.");
                    return false;
                }

                stateControlSecondDerivative[CollocationHessianIndex(0, 0)] = m_mixedHessianBuffer;

                stateControlSecondDerivative[CollocationHessianIndex(0, 1)] = m_zeroNxNuBuffer;

                stateControlSecondDerivative[CollocationHessianIndex(1, 0)] = m_zeroNxNuBuffer;


                if (!((m_dynamicalSystem_ptr->setControlInput(controlInputs[1])))){
                    reportError(m_info.name().c_str(), "evaluateCollocationConstraintSecondDerivatives", "Error while setting the control input.");
                    return false;
                }

                if (!(m_dynamicalSystem_ptr->dynamicsSecondPartialDerivativeWRTState(time + dT, collocationPoints[1], m_lambda, m_stateHessianBuffer))) {
                    reportError(m_info.name().c_str(), "evaluateCollocationConstraintSecondDerivatives",
                                "Error while evaluating the dynamical system state second derivative.");
                    return false;
                }

                stateSecondDerivative[CollocationHessianIndex(1, 1)] = m_stateHessianBuffer;


                if (!(m_dynamicalSystem_ptr->dynamicsSecondPartialDerivativeWRTControl(time + dT, collocationPoints[1], m_lambda, m_controlHessianBuffer))) {
                    reportError(m_info.name().c_str(), "evaluateCollocationConstraintSecondDerivatives",
                                "Error while evaluating the dynamical system control second derivative.");
                    return false;
                }

                controlSecondDerivative[CollocationHessianIndex(1, 1)] = m_controlHessianBuffer;


                if (!(m_dynamicalSystem_ptr->dynamicsSecondPartialDerivativeWRTStateControl(time + dT, collocationPoints[1], m_lambda, m_mixedHessianBuffer))) {
                    reportError(m_info.name().c_str(), "evaluateCollocationConstraintSecondDerivatives",
                                "Error while evaluating the dynamical system second derivative wrt state and control.");
                    return false;
                }

                stateControlSecondDerivative[CollocationHessianIndex(1, 1)] = m_mixedHessianBuffer;

                return true;
            }